

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprintconv.cpp
# Opt level: O0

void doit(void)

{
  FILE *__stream;
  FILE *__stream_00;
  FILE *__s;
  FILE *__stream_01;
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  size_type local_b8;
  uLongf len;
  int local_9c;
  long lStack_98;
  int total_outsize;
  size_t total_insize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rvz;
  vector<EventRow,_std::allocator<EventRow>_> rv;
  size_t i;
  EventIndex out_idx;
  EventIndex in_idx;
  int hasIntensityUncertainty;
  int intensity_bins;
  FILE *fouty;
  FILE *foutx;
  FILE *finy;
  FILE *finx;
  
  __stream = fopen("footprint.bin","rb");
  __stream_00 = fopen("footprint.idx","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"File not found footprint.bin\n");
    exit(-1);
  }
  if (__stream_00 == (FILE *)0x0) {
    fprintf(_stderr,"File not found footprint.idx\n");
    exit(-1);
  }
  __s = fopen("footprint.bin.z","wb");
  __stream_01 = fopen("footprint.idx.z","wb");
  in_idx.size._4_4_ = 0;
  in_idx.size._0_4_ = 0;
  fread((void *)((long)&in_idx.size + 4),4,1,__stream);
  fread(&in_idx.size,4,1,__stream);
  fprintf(_stderr,"intensity_bins: %d hasIntensityUncertainty: %d\n",(ulong)in_idx.size._4_4_,
          (ulong)(uint)in_idx.size);
  fwrite((void *)((long)&in_idx.size + 4),4,1,__s);
  fwrite(&in_idx.size,4,1,__s);
  rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)fread(&out_idx.size,0x14,1,__stream_00);
  std::vector<EventRow,_std::allocator<EventRow>_>::vector
            ((vector<EventRow,_std::allocator<EventRow>_> *)
             &rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_insize);
  lStack_98 = 0;
  local_9c = 0;
  stack0xffffffffffffffac = 8;
  while (rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage != (pointer)0x0) {
    fseek(__stream,stack0xffffffffffffffc0,0);
    std::vector<EventRow,_std::allocator<EventRow>_>::resize
              ((vector<EventRow,_std::allocator<EventRow>_> *)
               &rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,in_idx.offset);
    lStack_98 = lStack_98 + in_idx.offset;
    pvVar1 = std::vector<EventRow,_std::allocator<EventRow>_>::operator[]
                       ((vector<EventRow,_std::allocator<EventRow>_> *)
                        &rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    fread(pvVar1,4,in_idx.offset,__stream);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_insize);
    sVar2 = std::vector<EventRow,_std::allocator<EventRow>_>::size
                      ((vector<EventRow,_std::allocator<EventRow>_> *)
                       &rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_insize,
               sVar2 * 0xc + 0x400);
    local_b8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_insize);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_insize,0);
    pvVar1 = std::vector<EventRow,_std::allocator<EventRow>_>::operator[]
                       ((vector<EventRow,_std::allocator<EventRow>_> *)
                        &rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    compress(pvVar3,&local_b8,pvVar1,in_idx.offset);
    local_9c = local_9c + (int)local_b8;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_insize,0);
    fwrite(pvVar3,local_b8,1,__s);
    i._0_4_ = (undefined4)out_idx.size;
    out_idx.offset = local_b8;
    fwrite(&i,0x14,1,__stream_01);
    register0x00000000 = stack0xffffffffffffffac + local_b8;
    std::vector<EventRow,_std::allocator<EventRow>_>::clear
              ((vector<EventRow,_std::allocator<EventRow>_> *)
               &rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    rv.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)fread(&out_idx.size,0x14,1,__stream_00);
  }
  printf("TODO: expected input size  %zd\n",lStack_98 + 8);
  printf("TODO: expected output size  %d\n",(ulong)(local_9c + 8));
  fclose(__s);
  fclose(__stream_01);
  fclose(__stream);
  fclose(__stream_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total_insize);
  std::vector<EventRow,_std::allocator<EventRow>_>::~vector
            ((vector<EventRow,_std::allocator<EventRow>_> *)
             &rvz.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void doit()
{
    FILE *finx = fopen("footprint.bin", "rb");
	FILE *finy = fopen("footprint.idx", "rb");
    if (finx == NULL) {
        fprintf(stderr,"File not found footprint.bin\n");
        exit(-1);
    }
    if (finy == NULL) {
        fprintf(stderr,"File not found footprint.idx\n");
        exit(-1);
    }


    FILE *foutx = fopen("footprint.bin.z", "wb");
    FILE *fouty = fopen("footprint.idx.z", "wb");
    int intensity_bins = 0;
    int hasIntensityUncertainty =0;
    fread(&intensity_bins, sizeof(intensity_bins), 1, finx);
    fread(&hasIntensityUncertainty, sizeof(hasIntensityUncertainty), 1, finx);
    fprintf(stderr,"intensity_bins: %d hasIntensityUncertainty: %d\n",intensity_bins,hasIntensityUncertainty);
    fwrite(&intensity_bins, sizeof(intensity_bins), 1, foutx);
    fwrite(&hasIntensityUncertainty, sizeof(hasIntensityUncertainty), 1, foutx);

    EventIndex in_idx;
    EventIndex out_idx;
    size_t i = fread(&in_idx, sizeof(in_idx), 1, finy);
    std::vector<EventRow> rv;
    std::vector<unsigned char> rvz;
    size_t total_insize = 0;
    int total_outsize = 0;
    out_idx.offset = 8;
    while (i != 0) {
		flseek(finx, in_idx.offset, SEEK_SET);                
        rv.resize(in_idx.size);
        total_insize += in_idx.size;
        fread(&rv[0], sizeof(1), in_idx.size,finx);
        rvz.clear();
        rvz.resize(rv.size() * sizeof(EventRow) + 1024);
        uLongf len = (uLongf)rvz.size();
        compress(&rvz[0], &len, (unsigned char *)&rv[0], in_idx.size);
        total_outsize += len;
        fwrite((unsigned char *)&rvz[0], len, 1, foutx);
        out_idx.event_id = in_idx.event_id;        
        out_idx.size = len;
        fwrite(&out_idx, sizeof(out_idx), 1, fouty);
        // fprintf(stderr,"%d, %ld, %d\n", in_idx.event_id, in_idx.offset, in_idx.size);
        // fprintf(stderr,"%d, %ld, %d\n", out_idx.event_id, out_idx.offset, out_idx.size);
    /*  
        long long j=0;  
	    while (j < in_idx.size) {
            EventRow row;
            fread(&row, sizeof(row), 1,finx);
            // printf("%d, %d, %d, %.10e\n", in_idx.event_id,row.areaperil_id,row.intensity_bin_id, row.probability);

            j += sizeof(row);
	    }
*/
        out_idx.offset += len;;                
        rv.clear();
        i = fread(&in_idx, sizeof(in_idx), 1, finy);
    }

    printf("TODO: expected input size  %zd\n",total_insize+8);
    printf("TODO: expected output size  %d\n",total_outsize+8);
    fclose(foutx);
    fclose(fouty);
    fclose(finx);
    fclose(finy);
}